

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryUnorderedTypeHandler.h
# Opt level: O3

void __thiscall
Js::SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true>::
SimpleDictionaryUnorderedTypeHandler
          (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *this,
          VirtualTableInfoCtorEnum v)

{
  (this->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).propertyMap.
  ptr = (BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
         *)0x0;
  (this->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
  singletonInstance.ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  (this->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
  super_DynamicTypeHandler._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_0153f750;
  return;
}

Assistant:

private:
        template<class OtherTPropertyIndex, class OtherTMapKey, bool OtherIsNotExtensibleSupported>
        void CopyUnorderedStateFrom(const SimpleDictionaryUnorderedTypeHandler<OtherTPropertyIndex, OtherTMapKey, OtherIsNotExtensibleSupported> &other,
            DynamicObject *const object)
        {
            CompileAssert(sizeof(TPropertyIndex) >= sizeof(OtherTPropertyIndex));
            if (other.deletedPropertyIndex != PropertyIndexRanges<OtherTPropertyIndex>::NoSlots)
            {
                deletedPropertyIndex = other.deletedPropertyIndex;

                // If terminator values are different, walk to end of chain and update terminator value
                if ((int)PropertyIndexRanges<TPropertyIndex>::NoSlots != (int)PropertyIndexRanges<OtherTPropertyIndex>::NoSlots)
                {
                    OtherTPropertyIndex cur = other.deletedPropertyIndex;
                    for (;;)
                    {
                        OtherTPropertyIndex next = static_cast<OtherTPropertyIndex>(TaggedInt::ToInt32(object->GetSlot(cur)));
                        if (next == PropertyIndexRanges<OtherTPropertyIndex>::NoSlots)
                        {
                            this->SetSlotUnchecked(object, cur, TaggedInt::ToVarUnchecked(PropertyIndexRanges<TPropertyIndex>::NoSlots));
                            break;
                        }

                        cur = next;
                    }
                }
            }
        }